

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::Variable
          (Variable *this,string *name_,VarType *type,bool isArray)

{
  (this->super_TopLevelObject)._vptr_TopLevelObject = (_func_int **)&PTR__Variable_00a0b450;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name_);
  glu::VarType::VarType(&this->m_type,type);
  this->m_isArray = isArray;
  return;
}

Assistant:

Variable (const string& name_, const glu::VarType& type, bool isArray)
			: m_name		(name_)
			, m_type		(type)
			, m_isArray		(isArray)
		{
			DE_ASSERT(!type.isArrayType());
		}